

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

int __thiscall Assimp::ColladaParser::TestAttribute(ColladaParser *this,char *pAttr)

{
  int iVar1;
  undefined4 extraout_var;
  int a;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    iVar1 = (*this->mReader->_vptr_IIrrXMLReader[4])();
    if (iVar1 <= (int)uVar2) {
      return -1;
    }
    iVar1 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,(ulong)uVar2);
    iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),pAttr);
    if (iVar1 == 0) break;
    uVar2 = uVar2 + 1;
  }
  return uVar2;
}

Assistant:

int ColladaParser::TestAttribute(const char* pAttr) const
{
    for (int a = 0; a < mReader->getAttributeCount(); a++)
        if (strcmp(mReader->getAttributeName(a), pAttr) == 0)
            return a;

    return -1;
}